

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O1

void __thiscall
hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsNotValueHint(ValueKnowledge *this,int value)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  byte bVar3;
  
  if (-1 < value) {
    p_Var2 = (this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    if ((ulong)(uint)value <
        (ulong)(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) * 8)
    {
      if (this->value_ != value || this->value_ < 0) {
        bVar3 = (byte)value & 0x3f;
        puVar1 = p_Var2 + ((uint)value >> 6);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        return;
      }
      __assert_fail("value_ < 0 || value_ != value",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                    ,0x28,
                    "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsNotValueHint(int)"
                   );
    }
  }
  __assert_fail("value >= 0 && value < value_plausible_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                ,0x27,
                "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsNotValueHint(int)");
}

Assistant:

void HanabiHand::ValueKnowledge::ApplyIsNotValueHint(int value) {
  assert(value >= 0 && value < value_plausible_.size());
  assert(value_ < 0 || value_ != value);
  value_plausible_[value] = false;
}